

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::python::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  FileDescriptor *pFVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  LogMessage *other;
  LogFinisher local_1d9;
  MutexLock lock;
  string filename;
  string module_name;
  Printer printer;
  FileDescriptorProto fdp;
  ZeroCopyOutputStream *output;
  
  lock.mu_ = &this->mutex_;
  internal::Mutex::Lock(lock.mu_);
  this->file_ = file;
  anon_unknown_0::ModuleName(&module_name,*(string **)file);
  std::__cxx11::string::string((string *)&filename,(string *)&module_name);
  ReplaceCharacters(&filename,".",'/');
  std::__cxx11::string::append((char *)&filename);
  FileDescriptorProto::FileDescriptorProto(&fdp);
  FileDescriptor::CopyTo(this->file_,&fdp);
  MessageLite::SerializeToString((MessageLite *)&fdp,&this->file_descriptor_serialized_);
  iVar3 = (*context->_vptr_GeneratorContext[2])(context,&filename);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3);
  if (output == (ZeroCopyOutputStream *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&printer,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x14c);
    other = internal::LogMessage::operator<<((LogMessage *)&printer,"CHECK failed: output.get(): ");
    internal::LogFinisher::operator=(&local_1d9,other);
    internal::LogMessage::~LogMessage((LogMessage *)&printer);
  }
  io::Printer::Printer(&printer,output,'$');
  this->printer_ = &printer;
  pFVar1 = this->file_;
  bVar2 = GeneratingDescriptorProto(this);
  io::Printer::Print(&printer,
                     "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: $filename$\n\nimport sys\n_b=sys.version_info[0]<3 and (lambda x:x) or (lambda x:x.encode(\'latin1\'))\n"
                     ,"filename",*(string **)pFVar1);
  if (0 < *(int *)(pFVar1 + 0x68)) {
    io::Printer::Print(&printer,"from google.protobuf.internal import enum_type_wrapper\n");
  }
  io::Printer::Print(&printer,
                     "from google.protobuf import descriptor as _descriptor\nfrom google.protobuf import message as _message\nfrom google.protobuf import reflection as _reflection\nfrom google.protobuf import symbol_database as _symbol_database\n"
                    );
  if ((0 < *(int *)(pFVar1 + 0x78)) && (*(char *)(*(long *)(pFVar1 + 0xa0) + 0xa5) == '\x01')) {
    io::Printer::Print(&printer,
                       "from google.protobuf import service as _service\nfrom google.protobuf import service_reflection\n"
                      );
  }
  if (!bVar2) {
    io::Printer::Print(&printer,"from google.protobuf import descriptor_pb2\n");
  }
  io::Printer::Print(&printer,
                     "# @@protoc_insertion_point(imports)\n\n_sym_db = _symbol_database.Default()\n"
                    );
  io::Printer::Print(&printer,"\n\n");
  PrintImports(this);
  PrintFileDescriptor(this);
  PrintTopLevelEnums(this);
  PrintTopLevelExtensions(this);
  PrintAllNestedEnumsInFile(this);
  PrintMessageDescriptors(this);
  FixForeignFieldsInDescriptors(this);
  PrintMessages(this);
  FixForeignFieldsInExtensions(this);
  FixAllDescriptorOptions(this);
  if ((0 < *(int *)(file + 0x78)) && (*(char *)(*(long *)(file + 0xa0) + 0xa5) == '\x01')) {
    PrintServices(this);
  }
  io::Printer::Print(&printer,"# @@protoc_insertion_point(module_scope)\n");
  io::Printer::~Printer(&printer);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  FileDescriptorProto::~FileDescriptorProto(&fdp);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&module_name);
  internal::MutexLock::~MutexLock(&lock);
  return (bool)(printer.failed_ ^ 1);
}

Assistant:

bool Generator::Generate(const FileDescriptor* file,
                         const string& parameter,
                         GeneratorContext* context,
                         string* error) const {

  // Completely serialize all Generate() calls on this instance.  The
  // thread-safety constraints of the CodeGenerator interface aren't clear so
  // just be as conservative as possible.  It's easier to relax this later if
  // we need to, but I doubt it will be an issue.
  // TODO(kenton):  The proper thing to do would be to allocate any state on
  //   the stack and use that, so that the Generator class itself does not need
  //   to have any mutable members.  Then it is implicitly thread-safe.
  MutexLock lock(&mutex_);
  file_ = file;
  string module_name = ModuleName(file->name());
  string filename = module_name;
  ReplaceCharacters(&filename, ".", '/');
  filename += ".py";

  FileDescriptorProto fdp;
  file_->CopyTo(&fdp);
  fdp.SerializeToString(&file_descriptor_serialized_);


  google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output.get());
  io::Printer printer(output.get(), '$');
  printer_ = &printer;

  PrintTopBoilerplate(printer_, file_, GeneratingDescriptorProto());
  PrintImports();
  PrintFileDescriptor();
  PrintTopLevelEnums();
  PrintTopLevelExtensions();
  PrintAllNestedEnumsInFile();
  PrintMessageDescriptors();
  FixForeignFieldsInDescriptors();
  PrintMessages();
  // We have to fix up the extensions after the message classes themselves,
  // since they need to call static RegisterExtension() methods on these
  // classes.
  FixForeignFieldsInExtensions();
  // Descriptor options may have custom extensions. These custom options
  // can only be successfully parsed after we register corresponding
  // extensions. Therefore we parse all options again here to recognize
  // custom options that may be unknown when we define the descriptors.
  FixAllDescriptorOptions();
  if (HasGenericServices(file)) {
    PrintServices();
  }

  printer.Print(
    "# @@protoc_insertion_point(module_scope)\n");

  return !printer.failed();
}